

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::LogWithLocation(LogSeverity severity,char *file,int line,string *message)

{
  ostream *poVar1;
  string *in_RCX;
  int in_EDX;
  char *in_RSI;
  ostringstream s;
  string local_1c8 [44];
  int in_stack_fffffffffffffe64;
  string *in_stack_fffffffffffffe68;
  LogSeverity in_stack_fffffffffffffe74;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe68);
  poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffe68,in_RSI);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDX);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,in_RCX);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  Log(in_stack_fffffffffffffe74,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe68);
  return;
}

Assistant:

GTEST_API_ void LogWithLocation(testing::internal::LogSeverity severity,
                                const char* file, int line,
                                const string& message) {
  ::std::ostringstream s;
  s << file << ":" << line << ": " << message << ::std::endl;
  Log(severity, s.str(), 0);
}